

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O3

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  Inst *pIVar4;
  uchar *puVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  int iVar9;
  InstCond *pIVar10;
  int *__s;
  long lVar11;
  uchar *__dest;
  byte bVar12;
  _Head_base<0UL,_int_*,_false> _Var13;
  long lVar14;
  anon_struct_4_3_47ed7b4f_for_anon_union_4_5_a3ff96c3_for_Inst_2_3 aVar15;
  int iVar16;
  _Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter> _Var17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  size_type __n;
  uint uVar24;
  uint *puVar25;
  uint32_t uVar26;
  bool bVar27;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  Instq workq;
  Instq tovisit;
  ulong local_250;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  int *local_218;
  long local_210;
  long local_208;
  SparseSetT<void> local_200;
  SparseSetT<void> local_1d8;
  LogMessage local_1b0;
  
  if (this->did_onepass_ == true) {
    bVar27 = (this->onepass_nodes_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0;
  }
  else {
    this->did_onepass_ = true;
    if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
      lVar18 = (long)this->inst_count_[2] + 2;
      lVar14 = this->dfa_mem_;
      lVar11 = lVar14 + 3;
      if (-1 < lVar14) {
        lVar11 = lVar14;
      }
      iVar1 = this->bytemap_range_ * 4 + 4;
      __n = (size_type)iVar1;
      auVar6._8_8_ = lVar11 >> 0x3f;
      auVar6._0_8_ = lVar11 >> 2;
      if (lVar18 <= SUB168(auVar6 / SEXT816((long)__n),0)) {
        pIVar10 = __gnu_cxx::new_allocator<re2::InstCond>::allocate
                            ((new_allocator<re2::InstCond> *)&local_1b0,
                             (long)(this->inst_count_[3] + this->inst_count_[4] +
                                    this->inst_count_[6] + 1),(void *)0x0);
        iVar16 = this->size_;
        __s = __gnu_cxx::new_allocator<int>::allocate
                        ((new_allocator<int> *)&local_1b0,(long)iVar16,(void *)0x0);
        memset(__s,0xff,(long)iVar16 * 4);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (uchar *)0x0;
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SparseSetT<void>::SparseSetT(&local_1d8,iVar16);
        SparseSetT<void>::SparseSetT(&local_200,iVar16);
        AddQ(&local_1d8,this->start_);
        __s[this->start_] = 0;
        local_1b0.flushed_ = false;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                  (&local_238,
                   (iterator)
                   local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__n,&local_1b0.flushed_);
        if (local_1d8.size_ == 0) {
          iVar16 = 1;
LAB_001ccbaa:
          _Var17.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>._M_head_impl.
          len_ = (_Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>)(iVar16 * iVar1);
          this->dfa_mem_ =
               this->dfa_mem_ -
               (long)(int)_Var17.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>
                          ._M_head_impl.len_;
          if ((int)_Var17.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
                   _M_head_impl.len_ < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (uchar *)operator_new((ulong)(uint)_Var17.
                                                  super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>
                                                  ._M_head_impl.len_);
          puVar5 = (this->onepass_nodes_).ptr_._M_t.
                   super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __dest;
          if (puVar5 != (uchar *)0x0) {
            operator_delete(puVar5);
            __dest = (this->onepass_nodes_).ptr_._M_t.
                     super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          }
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
          super__Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false> =
               _Var17.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
               _M_head_impl.len_;
          memmove(__dest,local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                  (long)(int)_Var17.
                             super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
                             _M_head_impl.len_);
          bVar27 = true;
LAB_001ccbf3:
          SparseSetT<void>::~SparseSetT(&local_200);
          SparseSetT<void>::~SparseSetT(&local_1d8);
          if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (__s != (int *)0x0) {
            operator_delete(__s);
          }
          if (pIVar10 == (InstCond *)0x0) {
            return bVar27;
          }
          operator_delete(pIVar10);
          return bVar27;
        }
        iVar16 = 1;
        _Var13._M_head_impl =
             local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t
             .super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
        local_210 = lVar18;
LAB_001cc7a6:
        iVar3 = *_Var13._M_head_impl;
        local_208 = (long)__s[iVar3] * __n;
        puVar25 = (uint *)(local_238.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + local_208);
        if (0 < this->bytemap_range_) {
          lVar14 = 0;
          do {
            puVar25[lVar14 + 1] = 0x30;
            lVar14 = lVar14 + 1;
          } while (lVar14 < this->bytemap_range_);
        }
        *puVar25 = 0x30;
        local_200.size_ = 0;
        pIVar10->id = iVar3;
        bVar27 = false;
        pIVar10->cond = 0;
        local_250 = 1;
        local_218 = _Var13._M_head_impl;
LAB_001cc812:
        local_250 = (ulong)((int)local_250 - 1);
        uVar19 = (ulong)(uint)pIVar10[local_250].id;
        uVar26 = pIVar10[local_250].cond;
LAB_001cc821:
        lVar14 = (long)(int)uVar19;
        while( true ) {
          pIVar4 = (this->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
          uVar24 = pIVar4[lVar14].out_opcode_;
          uVar8 = uVar24 & 7;
          iVar3 = (int)lVar14;
          if (uVar8 != 1) break;
          bVar7 = AddQ(&local_200,iVar3 + 1);
          lVar14 = lVar14 + 1;
          if (!bVar7) goto LAB_001ccba1;
        }
        uVar20 = (&switchD_001cc85e::switchdataD_0033ef0c)[uVar8];
        switch(uVar8) {
        case 0:
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/onepass.cc"
                     ,0x1bf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"unhandled opcode: ",0x12);
          std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar4[lVar14].out_opcode_ & 7);
          LogMessage::~LogMessage(&local_1b0);
          goto switchD_001cc85e_caseD_7;
        case 1:
          SparseSetT<void>::~SparseSetT(&local_200);
          SparseSetT<void>::~SparseSetT(&local_1d8);
          if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (__s != (int *)0x0) {
            operator_delete(__s);
          }
          if (pIVar10 != (InstCond *)0x0) {
            operator_delete(pIVar10);
          }
          _Unwind_Resume((long)&switchD_001cc85e::switchdataD_0033ef0c + (long)(int)uVar20);
        case 2:
          iVar9 = __s[uVar24 >> 4];
          if (__s[uVar24 >> 4] == -1) {
            if ((int)local_210 <= iVar16) goto LAB_001ccba1;
            AddQ(&local_1d8,uVar24 >> 4);
            __s[pIVar4[lVar14].out_opcode_ >> 4] = iVar16;
            local_1b0.flushed_ = false;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                      (&local_238,
                       (iterator)
                       local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish,__n,&local_1b0.flushed_);
            puVar25 = (uint *)(local_238.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_208);
            iVar9 = iVar16;
            iVar16 = iVar16 + 1;
          }
          bVar2 = pIVar4[lVar14].field_1.field_3.lo_;
          uVar24 = (uint)bVar2;
          bVar12 = pIVar4[lVar14].field_1.field_3.hi_;
          if (bVar2 <= bVar12) {
            uVar20 = iVar9 << 0x10 | uVar26;
            uVar8 = uVar20 | 0x40;
            if (!bVar27) {
              uVar8 = uVar20;
            }
            do {
              bVar2 = this->bytemap_[(int)uVar24];
              iVar21 = uVar24 - 1;
              lVar11 = (long)(int)uVar24;
              do {
                if (0xfe < lVar11) {
                  iVar21 = 0xff;
                  break;
                }
                iVar21 = iVar21 + 1;
                lVar18 = lVar11 + 1;
                lVar11 = lVar11 + 1;
              } while (this->bytemap_[lVar18] == bVar2);
              if ((~puVar25[(ulong)bVar2 + 1] & 0x30) == 0) {
                puVar25[(ulong)bVar2 + 1] = uVar8;
                bVar12 = pIVar4[lVar14].field_1.field_3.hi_;
              }
              else if (puVar25[(ulong)bVar2 + 1] != uVar8) goto LAB_001ccba1;
              uVar24 = iVar21 + 1;
            } while (iVar21 < (int)(uint)bVar12);
          }
          if ((pIVar4[lVar14].field_1.out1_ & 0x10000) != 0) {
            aVar15 = pIVar4[lVar14].field_1.field_3;
            if (aVar15.lo_ < 0x62) {
              aVar15.lo_ = 'a';
              aVar15.hi_ = '\0';
              aVar15.hint_foldcase_ = 0;
            }
            if (0x79 < bVar12) {
              bVar12 = 0x7a;
            }
            if (aVar15.lo_ <= bVar12) {
              iVar21 = ((uint)aVar15 & 0xff) - 0x20;
              uVar8 = iVar9 << 0x10 | uVar26;
              uVar24 = uVar8 | 0x40;
              if (!bVar27) {
                uVar24 = uVar8;
              }
              do {
                bVar2 = this->bytemap_[iVar21];
                iVar9 = 0xff;
                if (0xff < iVar21) {
                  iVar9 = iVar21;
                }
                iVar22 = iVar21 + -1;
                lVar11 = (long)iVar21;
                do {
                  iVar23 = iVar9;
                  if (0xfe < lVar11) break;
                  iVar22 = iVar22 + 1;
                  lVar18 = lVar11 + 1;
                  lVar11 = lVar11 + 1;
                  iVar23 = iVar22;
                } while (this->bytemap_[lVar18] == bVar2);
                if ((~puVar25[(ulong)bVar2 + 1] & 0x30) == 0) {
                  puVar25[(ulong)bVar2 + 1] = uVar24;
                }
                else if (puVar25[(ulong)bVar2 + 1] != uVar24) goto LAB_001ccba1;
                iVar21 = iVar23 + 1;
              } while (iVar23 < (int)(bVar12 - 0x20));
            }
          }
          if ((pIVar4[lVar14].out_opcode_ & 8) != 0) goto switchD_001cc85e_caseD_7;
          bVar7 = AddQ(&local_200,iVar3 + 1);
          break;
        default:
          if ((uVar24 & 8) == 0) {
            bVar7 = AddQ(&local_200,iVar3 + 1);
            if (!bVar7) goto LAB_001ccba1;
            lVar11 = (long)(int)local_250;
            pIVar10[lVar11].id = iVar3 + 1;
            local_250 = (ulong)((int)local_250 + 1);
            pIVar10[lVar11].cond = uVar26;
            uVar24 = pIVar4[lVar14].out_opcode_;
          }
          if ((uVar24 & 7) == 4) {
            uVar26 = uVar26 | pIVar4[lVar14].field_1.out1_;
          }
          else if (((uVar24 & 7) == 3) && ((int)pIVar4[lVar14].field_1.field_3 < 10)) {
            uVar26 = uVar26 | 0x20 << (pIVar4[lVar14].field_1.field_3.lo_ & 0x1f);
          }
          bVar7 = AddQ(&local_200,uVar24 >> 4);
          if (bVar7) goto code_r0x001ccafd;
          goto LAB_001ccba1;
        case 5:
          if (bVar27) goto LAB_001ccba1;
          *puVar25 = uVar26;
          if ((pIVar4[lVar14].out_opcode_ & 8) != 0) goto LAB_001ccb6c;
          bVar7 = AddQ(&local_200,iVar3 + 1);
          bVar27 = true;
          break;
        case 7:
          goto switchD_001cc85e_caseD_7;
        }
        uVar19 = lVar14 + 1;
        if (bVar7 == false) {
LAB_001ccba1:
          bVar27 = false;
          goto LAB_001ccbf3;
        }
        goto LAB_001cc821;
      }
    }
    bVar27 = false;
  }
  return bVar27;
LAB_001ccb6c:
  bVar27 = true;
switchD_001cc85e_caseD_7:
  if ((int)local_250 < 1) goto LAB_001ccb74;
  goto LAB_001cc812;
code_r0x001ccafd:
  uVar19 = (ulong)(pIVar4[lVar14].out_opcode_ >> 4);
  goto LAB_001cc821;
LAB_001ccb74:
  _Var13._M_head_impl = local_218 + 1;
  if (_Var13._M_head_impl ==
      local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl + local_1d8.size_) goto LAB_001ccbaa;
  goto LAB_001cc7a6;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d >= %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (ExtraDebug)
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d\n", *it, ip->out());
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d\n", *it);
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (ExtraDebug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    std::map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    std::string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);
      dump += StringPrintf("node %d id=%d: matchcond=%#x\n",
                           nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        dump += StringPrintf("  %d cond %#x -> %d id=%d\n",
                             i, node->action[i] & 0xFFFF,
                             node->action[i] >> kIndexShift,
                             idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}